

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

void __thiscall
TPZMatrix<int>::SolveSOR
          (TPZMatrix<int> *this,int64_t *numiterations,TPZFMatrix<int> *F,TPZFMatrix<int> *result,
          TPZFMatrix<int> *residual,TPZFMatrix<int> *param_6,REAL overrelax,REAL *tol,
          int FromCurrent,int direction)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  int64_t iVar6;
  int *piVar7;
  long *in_RCX;
  TPZBaseMatrix *in_RDX;
  long *in_RSI;
  long *in_RDI;
  TPZBaseMatrix *in_R8;
  double in_XMM0_Qa;
  __type_conflict _Var8;
  double *in_stack_00000008;
  int in_stack_00000010;
  int64_t j;
  int64_t ic;
  int eqres;
  int64_t it;
  int64_t iinc;
  int64_t ilast;
  int64_t ifirst;
  int64_t i;
  int64_t c;
  int64_t r;
  int res;
  long col;
  long row;
  undefined4 in_stack_ffffffffffffff80;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  int local_3c;
  
  if (in_R8 == in_RDX) {
    std::operator<<((ostream *)&std::cout,
                    "TPZMatrix::SolveSOR called with residual and F equal, no solution\n");
  }
  else {
    local_3c = (int)*in_stack_00000008 * 2 + 1;
    if (in_R8 != (TPZBaseMatrix *)0x0) {
      local_3c = ::Norm((TPZFMatrix<int> *)0x12f2534);
    }
    if (in_stack_00000010 == 0) {
      (**(code **)(*in_RCX + 0x78))();
    }
    lVar5 = (**(code **)(*in_RDI + 0x60))();
    iVar6 = TPZBaseMatrix::Cols(in_RDX);
    local_60 = 0;
    local_70 = 1;
    local_68 = lVar5;
    if ((int)j == -1) {
      local_60 = lVar5 + -1;
      local_68 = -1;
      local_70 = -1;
    }
    local_78 = 0;
    while( true ) {
      bVar1 = false;
      if (local_78 < *in_RSI) {
        _Var8 = std::fabs<int>(local_3c);
        bVar1 = ABS(*in_stack_00000008) < _Var8;
      }
      if (!bVar1) break;
      for (row = 0; row < iVar6; row = row + 1) {
        for (local_58 = local_60; local_58 != local_68; local_58 = local_70 + local_58) {
          iVar2 = (*(in_RDX->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDX,local_58,row);
          for (col = 0; col < lVar5; col = col + 1) {
            iVar3 = (**(code **)(*in_RDI + 0x120))(in_RDI,local_58,col);
            piVar7 = TPZFMatrix<int>::operator()
                               ((TPZFMatrix<int> *)CONCAT44(iVar2,in_stack_ffffffffffffff80),row,col
                               );
            iVar2 = iVar2 - iVar3 * *piVar7;
          }
          iVar3 = (int)in_XMM0_Qa * iVar2;
          iVar4 = (**(code **)(*in_RDI + 0x120))(in_RDI,local_58,local_58);
          piVar7 = TPZFMatrix<int>::operator()
                             ((TPZFMatrix<int> *)CONCAT44(iVar2,in_stack_ffffffffffffff80),row,col);
          *piVar7 = iVar3 / iVar4 + *piVar7;
        }
      }
      _Var8 = std::sqrt<int>(0);
      local_3c = (int)_Var8;
      local_78 = local_78 + 1;
    }
    if (in_R8 != (TPZBaseMatrix *)0x0) {
      (**(code **)(*in_RDI + 0x140))(in_RDI,in_RCX,in_RDX,in_R8);
    }
    *in_RSI = local_78;
    _Var8 = std::fabs<int>(local_3c);
    *in_stack_00000008 = _Var8;
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::SolveSOR(int64_t & numiterations, const TPZFMatrix<TVar> &F,
							   TPZFMatrix<TVar> &result, TPZFMatrix<TVar> *residual, TPZFMatrix<TVar> &/*scratch*/, const REAL overrelax,
							   REAL &tol,const int FromCurrent,const int direction) {
	
	if(residual == &F) {
		cout << "TPZMatrix::SolveSOR called with residual and F equal, no solution\n";
		return;
	}
	TVar res = (TVar)2*(TVar)tol+(TVar)1.;
	if(residual) res = Norm(*residual);
	if(!FromCurrent) {
		result.Zero();
	}
	int64_t r = Dim();
	int64_t c = F.Cols();
	int64_t i,ifirst = 0, ilast = r, iinc = 1;
	int64_t it;
	if(direction == -1) {
		ifirst = r-1;  //misael
		ilast = -1;
		iinc = -1;
	}
	TVar eqres;
	for(it=0; it<numiterations && (REAL)(fabs(res)) > fabs(tol); it++) {
		res = 0.;
		for(int64_t ic=0; ic<c; ic++) {
			for(i=ifirst; i!=ilast; i+= iinc) {
				eqres = F.GetVal(i,ic);
				for(int64_t j=0; j<r; j++) {
					eqres -= GetVal(i,j)*result(j,ic);
				}
				res += eqres*eqres;
				result(i,ic) += (TVar)overrelax*eqres/GetVal(i,i);
			}
		}
		res = sqrt(res);
	}
	if(residual) Residual(result,F,*residual);
	numiterations = it;
	tol = fabs(res);
}